

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tessellation_cache.cpp
# Opt level: O2

void __thiscall
embree::cache_regression_test::thread_alloc(cache_regression_test *this,cache_regression_test *This)

{
  atomic<int> *paVar1;
  SharedLazyTessellationCache *this_00;
  uint *puVar2;
  _func_int **pp_Var3;
  bool bVar4;
  long lVar5;
  int *piVar6;
  long *plVar7;
  ulong uVar8;
  long *plVar9;
  size_t k;
  undefined **this_01;
  uint uVar10;
  ulong *puVar11;
  cache_regression_test *t_state;
  undefined1 local_89 [9];
  size_t N;
  size_t elt;
  undefined8 local_70;
  long *local_68;
  CacheEntry *local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  undefined1 local_40 [16];
  
  LOCK();
  paVar1 = &this->threadIDCounter;
  local_50 = (ulong)(uint)(paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  local_58 = DAT_0220a5c0 >> 2;
  local_70 = &this->barrier;
  BarrierSys::wait((BarrierSys *)local_70,This);
  local_60 = this->entry;
  this_01 = &PTR_021f7e08;
  local_89._1_8_ = this;
  lVar5 = __tls_get_addr();
  plVar9 = (long *)(lVar5 + 8);
  lVar5 = 0;
  local_68 = plVar9;
  do {
    if (lVar5 == 100000) {
      BarrierSys::wait((BarrierSys *)local_70,This);
      return;
    }
    uVar10 = (int)lVar5 + (int)local_50 & 0xfff;
    elt = (size_t)uVar10;
    N = (size_t)((uVar10 % 1000) * 10 + 1);
    if (local_58 <= N) {
      N = local_58;
    }
    local_40._0_8_ = &N;
    local_40._8_8_ = &elt;
    t_state = (cache_regression_test *)*plVar9;
    local_48 = lVar5;
    if (t_state == (cache_regression_test *)0x0) {
      this_01 = (undefined **)&SharedLazyTessellationCache::sharedLazyTessellationCache;
      SharedLazyTessellationCache::getNextRenderThreadWorkState
                ((SharedLazyTessellationCache *)
                 &SharedLazyTessellationCache::sharedLazyTessellationCache);
      t_state = (cache_regression_test *)*plVar9;
    }
    puVar11 = (ulong *)((long)&(local_60->tag).data.super_atomic<long>.super___atomic_base<long>.
                               _M_i + (ulong)(uVar10 << 4));
    this_00 = (SharedLazyTessellationCache *)(puVar11 + 1);
LAB_005d2532:
    while( true ) {
      LOCK();
      pp_Var3 = (t_state->super_RegressionTest)._vptr_RegressionTest;
      (t_state->super_RegressionTest)._vptr_RegressionTest =
           (_func_int **)((long)(t_state->super_RegressionTest)._vptr_RegressionTest + 1);
      UNLOCK();
      if (pp_Var3 < (_func_int **)0x4) break;
      LOCK();
      (t_state->super_RegressionTest)._vptr_RegressionTest =
           (_func_int **)((long)(t_state->super_RegressionTest)._vptr_RegressionTest + -1);
      UNLOCK();
      This = t_state;
      SharedLazyTessellationCache::waitForUsersLessEqual
                ((SharedLazyTessellationCache *)this_01,(ThreadWorkState *)t_state,0);
    }
    uVar8 = *puVar11;
    if (uVar8 != 0) {
      piVar6 = (int *)((uVar8 & 0xffffffffff) +
                      SharedLazyTessellationCache::sharedLazyTessellationCache);
      if (piVar6 != (int *)0x0 && DAT_0220a4c0 <= ((long)uVar8 >> 0x28) + 7U) goto LAB_005d2615;
    }
    local_89[0] = 0;
    if ((((__atomic_base<bool> *)&this_00->data)->_M_i & 1U) != 0) {
LAB_005d25c1:
      LOCK();
      (t_state->super_RegressionTest)._vptr_RegressionTest =
           (_func_int **)((long)(t_state->super_RegressionTest)._vptr_RegressionTest + -1);
      UNLOCK();
      goto LAB_005d2532;
    }
    This = (cache_regression_test *)local_89;
    this_01 = (undefined **)this_00;
    bVar4 = std::atomic<bool>::compare_exchange_strong
                      ((atomic<bool> *)this_00,(bool *)This,true,memory_order_acquire);
    if (!bVar4) goto LAB_005d25c1;
    if ((*puVar11 != 0) && (DAT_0220a4c0 <= ((long)*puVar11 >> 0x28) + 7U)) {
      ((__atomic_base<bool> *)&this_00->data)->_M_i = false;
      goto LAB_005d25c1;
    }
    this_01 = (undefined **)local_40;
    piVar6 = thread_alloc::anon_class_16_2_fa5d65c8::operator()((anon_class_16_2_fa5d65c8 *)this_01)
    ;
    uVar8 = DAT_0220a4c0 << 0x28 |
            (long)piVar6 - SharedLazyTessellationCache::sharedLazyTessellationCache;
    if (piVar6 == (int *)0x0) {
      uVar8 = 0;
    }
    LOCK();
    *puVar11 = uVar8;
    UNLOCK();
    *(undefined1 *)(puVar11 + 1) = 0;
LAB_005d2615:
    lVar5 = local_48;
    plVar9 = local_68;
    if (piVar6 == (int *)0x0) {
      plVar7 = (long *)*local_68;
      if (plVar7 == (long *)0x0) {
        this_01 = (undefined **)&SharedLazyTessellationCache::sharedLazyTessellationCache;
        SharedLazyTessellationCache::getNextRenderThreadWorkState
                  ((SharedLazyTessellationCache *)
                   &SharedLazyTessellationCache::sharedLazyTessellationCache);
        plVar7 = (long *)*plVar9;
      }
      LOCK();
      *plVar7 = *plVar7 + -1;
      UNLOCK();
      LOCK();
      (((atomic<unsigned_long> *)(local_89._1_8_ + 0x30))->super___atomic_base<unsigned_long>)._M_i
           = (((atomic<unsigned_long> *)(local_89._1_8_ + 0x30))->super___atomic_base<unsigned_long>
             )._M_i + 1;
      UNLOCK();
    }
    else {
      This = (cache_regression_test *)0x0;
      do {
        if ((cache_regression_test *)N == This) goto LAB_005d2648;
        puVar2 = (uint *)(piVar6 + (long)This);
        this_01 = (undefined **)(ulong)*puVar2;
        This = (cache_regression_test *)
               ((long)&(This->super_RegressionTest)._vptr_RegressionTest + 1);
      } while (*puVar2 == (uint)elt);
      LOCK();
      (((atomic<unsigned_long> *)(local_89._1_8_ + 0x30))->super___atomic_base<unsigned_long>)._M_i
           = (((atomic<unsigned_long> *)(local_89._1_8_ + 0x30))->super___atomic_base<unsigned_long>
             )._M_i + 1;
      UNLOCK();
LAB_005d2648:
      plVar7 = (long *)*local_68;
      if (plVar7 == (long *)0x0) {
        this_01 = (undefined **)&SharedLazyTessellationCache::sharedLazyTessellationCache;
        SharedLazyTessellationCache::getNextRenderThreadWorkState
                  ((SharedLazyTessellationCache *)
                   &SharedLazyTessellationCache::sharedLazyTessellationCache);
        plVar7 = (long *)*plVar9;
      }
      LOCK();
      *plVar7 = *plVar7 + -1;
      UNLOCK();
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

static void thread_alloc(cache_regression_test* This)
    {
      int threadID = This->threadIDCounter++;
      size_t maxN = SharedLazyTessellationCache::sharedLazyTessellationCache.maxAllocSize()/4;
      This->barrier.wait();

      for (size_t j=0; j<100000; j++)
      {
        size_t elt = (threadID+j)%numEntries;
        size_t N = min(1+10*(elt%1000),maxN);
          
        volatile int* data = (volatile int*) SharedLazyTessellationCache::lookup(This->entry[elt],0,[&] () {
            int* data = (int*) SharedLazyTessellationCache::sharedLazyTessellationCache.malloc(4*N);
            for (size_t k=0; k<N; k++) data[k] = (int)elt;
            return data;
          });
        
        if (data == nullptr) {
          SharedLazyTessellationCache::sharedLazyTessellationCache.unlock();
          This->numFailed++;
          continue;
        }
            
        /* check memory block */
        for (size_t k=0; k<N; k++) {
          if (data[k] != (int)elt) {
            This->numFailed++;
            break;
          }
        }
        
        SharedLazyTessellationCache::sharedLazyTessellationCache.unlock();
      }
      This->barrier.wait();
    }